

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib539.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long local_38;
  curl_slist *slist;
  char *newURL;
  CURL *curl;
  CURLcode res;
  char *URL_local;
  
  slist = (curl_slist *)0x0;
  local_38 = 0;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      curl._4_4_ = curl_easy_setopt(lVar2,0x2712,URL);
      if (((curl._4_4_ == 0) && (curl._4_4_ = curl_easy_setopt(lVar2,0x29,1), curl._4_4_ == 0)) &&
         (curl._4_4_ = curl_easy_setopt(lVar2,0x8a,3), curl._4_4_ == 0)) {
        curl_easy_perform(lVar2);
        slist = (curl_slist *)curl_maprintf("%s./",URL);
        if (slist == (curl_slist *)0x0) {
          curl_easy_cleanup(lVar2);
          curl_global_cleanup();
          return 0x7e;
        }
        local_38 = curl_slist_append(0,"SYST");
        if (local_38 == 0) {
          free(slist);
          curl_easy_cleanup(lVar2);
          curl_global_cleanup();
          return 0x7e;
        }
        curl._4_4_ = curl_easy_setopt(lVar2,0x2712,slist);
        if (((curl._4_4_ == 0) && (curl._4_4_ = curl_easy_setopt(lVar2,0x8a,2), curl._4_4_ == 0)) &&
           (curl._4_4_ = curl_easy_setopt(lVar2,0x272c,local_38), curl._4_4_ == 0)) {
          curl._4_4_ = curl_easy_perform(lVar2);
        }
      }
      curl_slist_free_all(local_38);
      free(slist);
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
      URL_local._4_4_ = curl._4_4_;
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
   CURLcode res;
   CURL *curl;
   char *newURL = NULL;
   struct curl_slist *slist = NULL;

   if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
     fprintf(stderr, "curl_global_init() failed\n");
     return TEST_ERR_MAJOR_BAD;
   }

   curl = curl_easy_init();
   if(!curl) {
     fprintf(stderr, "curl_easy_init() failed\n");
     curl_global_cleanup();
     return TEST_ERR_MAJOR_BAD;
   }

   /*
    * Begin with curl set to use a single CWD to the URL's directory.
    */
   test_setopt(curl, CURLOPT_URL, URL);
   test_setopt(curl, CURLOPT_VERBOSE, 1L);
   test_setopt(curl, CURLOPT_FTP_FILEMETHOD, (long) CURLFTPMETHOD_SINGLECWD);

   res = curl_easy_perform(curl);

   /*
    * Change the FTP_FILEMETHOD option to use full paths rather than a CWD
    * command.  Alter the URL's path a bit, appending a "./".  Use an innocuous
    * QUOTE command, after which curl will CWD to ftp_conn->entrypath and then
    * (on the next call to ftp_statemach_act) find a non-zero ftpconn->dirdepth
    * even though no directories are stored in the ftpconn->dirs array (after a
    * call to freedirs).
    */
   newURL = aprintf("%s./", URL);
   if(newURL == NULL) {
     curl_easy_cleanup(curl);
     curl_global_cleanup();
     return TEST_ERR_MAJOR_BAD;
   }

   slist = curl_slist_append(NULL, "SYST");
   if(slist == NULL) {
     free(newURL);
     curl_easy_cleanup(curl);
     curl_global_cleanup();
     return TEST_ERR_MAJOR_BAD;
   }

   test_setopt(curl, CURLOPT_URL, newURL);
   test_setopt(curl, CURLOPT_FTP_FILEMETHOD, (long) CURLFTPMETHOD_NOCWD);
   test_setopt(curl, CURLOPT_QUOTE, slist);

   res = curl_easy_perform(curl);

test_cleanup:

   curl_slist_free_all(slist);
   free(newURL);
   curl_easy_cleanup(curl);
   curl_global_cleanup();

   return (int)res;
}